

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::StringReplace
              (JavascriptString *match,JavascriptString *input,JavascriptString *replace)

{
  char16 cVar1;
  code *pcVar2;
  charcount_t appendCharLength;
  charcount_t cVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  char *pcVar6;
  char16 *content;
  char16 *prefix;
  ScriptContext *pSVar7;
  undefined4 *puVar8;
  bool bVar9;
  uint local_2a0;
  uint local_29c;
  CharCount j;
  CharCount i;
  Builder<256U> concatenated;
  BufferStringBuilder bufferString;
  CharCount newLength;
  CharCount postfixLength;
  char16 *postfixStr;
  CharCount prefixLength;
  char16 *prefixStr;
  char16 *inputStr;
  CharCount i_1;
  bool definitelyNoEscapes;
  char16 *replaceStr;
  CharCount matchedIndex;
  JavascriptString *replace_local;
  JavascriptString *input_local;
  JavascriptString *match_local;
  
  pcVar6 = JavascriptString::strstr((char *)input,(char *)match);
  appendCharLength = (charcount_t)pcVar6;
  match_local = input;
  if (appendCharLength != 0xffffffff) {
    content = JavascriptString::GetString(replace);
    cVar3 = JavascriptString::GetLength(replace);
    bVar9 = cVar3 == 0;
    if ((!bVar9) && (cVar3 = JavascriptString::GetLength(replace), cVar3 < 9)) {
      inputStr._0_4_ = 0;
      while( true ) {
        cVar3 = JavascriptString::GetLength(replace);
        bVar9 = false;
        if ((uint)inputStr < cVar3) {
          bVar9 = content[(uint)inputStr] != L'$';
        }
        if (!bVar9) break;
        inputStr._0_4_ = (uint)inputStr + 1;
      }
      cVar3 = JavascriptString::GetLength(replace);
      bVar9 = cVar3 <= (uint)inputStr;
    }
    if (bVar9) {
      prefix = JavascriptString::GetString(input);
      cVar3 = JavascriptString::GetLength(match);
      cVar4 = JavascriptString::GetLength(input);
      cVar5 = JavascriptString::GetLength(match);
      cVar5 = (cVar4 - appendCharLength) - cVar5;
      cVar4 = JavascriptString::GetLength(replace);
      pSVar7 = RecyclableObject::GetScriptContext(&match->super_RecyclableObject);
      BufferStringBuilder::BufferStringBuilder
                ((BufferStringBuilder *)&concatenated.isFinalized,appendCharLength + cVar5 + cVar4,
                 pSVar7);
      cVar4 = JavascriptString::GetLength(replace);
      BufferStringBuilder::SetContent
                ((BufferStringBuilder *)&concatenated.isFinalized,prefix,appendCharLength,content,
                 cVar4,prefix + ((ulong)pcVar6 & 0xffffffff) + (ulong)cVar3,cVar5);
      match_local = BufferStringBuilder::ToString((BufferStringBuilder *)&concatenated.isFinalized);
    }
    else {
      pSVar7 = RecyclableObject::GetScriptContext(&input->super_RecyclableObject);
      CompoundString::Builder<256U>::Builder((Builder<256U> *)&j,pSVar7);
      CompoundString::Builder<256U>::Append((Builder<256U> *)&j,input,0,appendCharLength);
      local_29c = 0;
      for (local_2a0 = 0; cVar3 = JavascriptString::GetLength(replace), local_2a0 < cVar3;
          local_2a0 = local_2a0 + 1) {
        if ((content[local_2a0] == L'$') &&
           (cVar3 = JavascriptString::GetLength(replace), local_2a0 + 1 < cVar3)) {
          cVar1 = content[local_2a0 + 1];
          if (cVar1 == L'$') {
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)&j,replace,local_29c,(local_2a0 + 1) - local_29c);
            local_29c = local_2a0 + 2;
          }
          else if (cVar1 == L'&') {
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)&j,replace,local_29c,local_2a0 - local_29c);
            CompoundString::Builder<256U>::Append((Builder<256U> *)&j,match);
            local_29c = local_2a0 + 2;
          }
          else if (cVar1 == L'\'') {
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)&j,replace,local_29c,local_2a0 - local_29c);
            cVar3 = JavascriptString::GetLength(match);
            cVar4 = JavascriptString::GetLength(input);
            cVar5 = JavascriptString::GetLength(match);
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)&j,input,appendCharLength + cVar3,
                       (cVar4 - appendCharLength) - cVar5);
            local_29c = local_2a0 + 2;
          }
          else if (cVar1 == L'`') {
            CompoundString::Builder<256U>::Append
                      ((Builder<256U> *)&j,replace,local_29c,local_2a0 - local_29c);
            CompoundString::Builder<256U>::Append((Builder<256U> *)&j,input,0,appendCharLength);
            local_29c = local_2a0 + 2;
          }
          local_2a0 = local_2a0 + 1;
        }
      }
      if (local_2a0 < local_29c) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x5c5,"(i <= j)","i <= j");
        if (!bVar9) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)&j,replace,local_29c,local_2a0 - local_29c);
      cVar3 = JavascriptString::GetLength(match);
      cVar4 = JavascriptString::GetLength(input);
      cVar5 = JavascriptString::GetLength(match);
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)&j,input,appendCharLength + cVar3,
                 (cVar4 - appendCharLength) - cVar5);
      match_local = CompoundString::Builder<256U>::ToString((Builder<256U> *)&j);
    }
  }
  return match_local;
}

Assistant:

Var RegexHelper::StringReplace(JavascriptString* match, JavascriptString* input, JavascriptString* replace)
    {
        CharCount matchedIndex = JavascriptString::strstr(input, match, true);
        if (matchedIndex == CharCountFlag)
        {
            return input;
        }

        const char16 *const replaceStr = replace->GetString();

        // Unfortunately, due to the possibility of there being $ escapes, we can't just wmemcpy the replace string. Check if we
        // have a small replace string that we can quickly scan for '$', to see if we can just wmemcpy.
        bool definitelyNoEscapes = replace->GetLength() == 0;
        if(!definitelyNoEscapes && replace->GetLength() <= 8)
        {
            CharCount i = 0;
            for(; i < replace->GetLength() && replaceStr[i] != _u('$'); ++i);
            definitelyNoEscapes = i >= replace->GetLength();
        }

        if(definitelyNoEscapes)
        {
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = (CharCount)matchedIndex;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                                    replaceStr, replace->GetLength(),
                                    postfixStr, postfixLength);
            return bufferString.ToString();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(input->GetScriptContext());

        // Copy portion of input string that precedes the matched substring
        concatenated.Append(input, 0, matchedIndex);

        // Copy the replace string with substitutions
        CharCount i = 0, j = 0;
        for(; j < replace->GetLength(); ++j)
        {
            if(replaceStr[j] == _u('$') && j + 1 < replace->GetLength())
            {
                switch(replaceStr[j + 1])
                {
                    case _u('$'): // literal '$'
                        ++j;
                        concatenated.Append(replace, i, j - i);
                        i = j + 1;
                        break;

                    case _u('&'): // matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(match);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('`'): // portion of input string that precedes the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(input, 0, matchedIndex);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('\''): // portion of input string that follows the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(
                            input,
                            matchedIndex + match->GetLength(),
                            input->GetLength() - matchedIndex - match->GetLength());
                        ++j;
                        i = j + 1;
                        break;

                    default: // take both the initial '$' and the following character literally
                        ++j;
                }
            }
        }
        Assert(i <= j);
        concatenated.Append(replace, i, j - i);

        // Copy portion of input string that follows the matched substring
        concatenated.Append(input, matchedIndex + match->GetLength(), input->GetLength() - matchedIndex - match->GetLength());

        return concatenated.ToString();
    }